

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O1

string * __thiscall
LinearRegression::generateTestDataEvaluation_abi_cxx11_
          (string *__return_storage_ptr__,LinearRegression *this)

{
  __node_base_ptr *pp_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong __val;
  bool bVar4;
  long lVar5;
  string *psVar6;
  char cVar7;
  long *plVar8;
  size_t sVar9;
  Attribute *pAVar10;
  undefined8 *puVar11;
  long *plVar12;
  undefined8 *puVar13;
  Query **ppQVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  __node_base *p_Var17;
  ulong *puVar18;
  size_type *psVar19;
  _func_int ***ppp_Var20;
  pointer *ppFVar21;
  ulong *puVar22;
  ulong uVar23;
  _Hash_node_base **pp_Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  char cVar26;
  LinearRegression *pLVar27;
  _Hash_node_base *p_Var28;
  __node_base _Var29;
  Query *pQVar30;
  _func_int **pp_Var31;
  pointer puVar32;
  undefined8 uVar33;
  pointer pFVar34;
  _Alloc_hider _Var35;
  ulong uVar36;
  string evalFunction;
  string prediction;
  string loadFunction;
  string testTuple;
  string attrConstruct;
  string attributeString;
  undefined1 local_5e0 [32];
  string local_5c0;
  pointer *local_5a0;
  long local_598;
  pointer local_590;
  long lStack_588;
  _Alloc_hider local_580;
  long local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  Query **local_540;
  long local_538;
  Query *local_530;
  long lStack_528;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  __node_base *local_4c0;
  long local_4b8;
  __node_base local_4b0;
  long lStack_4a8;
  Query **local_4a0;
  long local_498;
  Query *local_490;
  undefined8 uStack_488;
  __node_base *local_480;
  long local_478;
  __node_base local_470;
  long lStack_468;
  __node_base_ptr *local_460;
  undefined8 local_458;
  __node_base_ptr local_450;
  undefined8 uStack_448;
  _func_int ***local_440;
  long local_438;
  _func_int **local_430;
  long lStack_428;
  _func_int ***local_420;
  long local_418;
  _func_int **local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  _Hash_node_base **local_3e0;
  long local_3d8;
  _Hash_node_base *local_3d0;
  long lStack_3c8;
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  long lStack_3a8;
  _func_int ***local_3a0;
  long local_398;
  _func_int **local_390;
  long lStack_388;
  ulong *local_380;
  long local_378;
  ulong local_370;
  long lStack_368;
  _func_int ***local_360;
  long local_358;
  _func_int **local_350;
  long lStack_348;
  ulong *local_340;
  long local_338;
  ulong local_330;
  long lStack_328;
  _func_int ***local_320;
  long local_318;
  _func_int **local_310;
  long lStack_308;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  LinearRegression *local_260;
  pointer *local_258;
  long local_250;
  pointer local_248 [2];
  pointer *local_238;
  long local_230;
  pointer local_228 [2];
  pointer *local_218;
  long local_210;
  pointer local_208 [2];
  _func_int ***local_1f8;
  long local_1f0;
  _func_int **local_1e8 [2];
  _func_int ***local_1d8;
  long local_1d0;
  _func_int **local_1c8 [2];
  _func_int ***local_1b8;
  long local_1b0;
  _func_int **local_1a8 [2];
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  _func_int ***local_178;
  long local_170;
  _func_int **local_168 [2];
  ulong *local_158;
  long local_150;
  ulong local_148 [2];
  _func_int ***local_138;
  long local_130;
  _func_int **local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  _func_int ***local_f8;
  long local_f0;
  _func_int **local_e8 [2];
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  _func_int ***local_b8;
  long local_b0;
  _func_int **local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  string *local_38;
  
  local_58[0] = local_48;
  local_260 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_4e0,'\f');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4e0);
  local_98 = &local_88;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_88 = *plVar12;
    lStack_80 = plVar8[3];
  }
  else {
    local_88 = *plVar12;
    local_98 = (long *)*plVar8;
  }
  local_90 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_38 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p);
  }
  uVar36 = 0;
  while( true ) {
    paVar15 = &local_4e0.field_2;
    sVar9 = TreeDecomposition::numberOfAttributes
                      ((local_260->_td).
                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar9 <= uVar36) break;
    pAVar10 = TreeDecomposition::getAttribute
                        ((local_260->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         uVar36);
    local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_560,'\x0f');
    puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_560,0,(char *)0x0,0x2b2de1);
    local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
    puVar13 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_5c0.field_2._M_allocated_capacity = *puVar13;
      local_5c0.field_2._8_8_ = puVar11[3];
    }
    else {
      local_5c0.field_2._M_allocated_capacity = *puVar13;
      local_5c0._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_5c0._M_string_length = puVar11[1];
    *puVar11 = puVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5c0);
    pLVar27 = (LinearRegression *)(puVar11 + 2);
    if ((LinearRegression *)*puVar11 == pLVar27) {
      local_5e0._16_8_ = (pLVar27->super_Application)._vptr_Application;
      local_5e0._24_8_ = puVar11[3];
      local_5e0._0_8_ = (LinearRegression *)(local_5e0 + 0x10);
    }
    else {
      local_5e0._16_8_ = (pLVar27->super_Application)._vptr_Application;
      local_5e0._0_8_ = (LinearRegression *)*puVar11;
    }
    local_5e0._8_8_ = puVar11[1];
    *puVar11 = pLVar27;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    typeToStr_abi_cxx11_(&local_520,(LinearRegression *)(local_5e0 + 0x10),pAVar10->_type);
    pp_Var31 = (_func_int **)0xf;
    if ((LinearRegression *)local_5e0._0_8_ != (LinearRegression *)(local_5e0 + 0x10)) {
      pp_Var31 = (_func_int **)local_5e0._16_8_;
    }
    if (pp_Var31 < (_func_int **)(local_520._M_string_length + local_5e0._8_8_)) {
      uVar33 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        uVar33 = local_520.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar33 < (_func_int **)(local_520._M_string_length + local_5e0._8_8_))
      goto LAB_0014cb4b;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,local_5e0._0_8_);
    }
    else {
LAB_0014cb4b:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_5e0,(ulong)local_520._M_dataplus._M_p);
    }
    local_5a0 = &local_590;
    ppFVar21 = (pointer *)(puVar11 + 2);
    if ((pointer *)*puVar11 == ppFVar21) {
      local_590 = *ppFVar21;
      lStack_588 = puVar11[3];
    }
    else {
      local_590 = *ppFVar21;
      local_5a0 = (pointer *)*puVar11;
    }
    local_598 = puVar11[1];
    *puVar11 = ppFVar21;
    puVar11[1] = 0;
    *(undefined1 *)ppFVar21 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_5a0);
    local_540 = &local_530;
    ppQVar14 = (Query **)(plVar8 + 2);
    if ((Query **)*plVar8 == ppQVar14) {
      local_530 = *ppQVar14;
      lStack_528 = plVar8[3];
    }
    else {
      local_530 = *ppQVar14;
      local_540 = (Query **)*plVar8;
    }
    local_538 = plVar8[1];
    *plVar8 = (long)ppQVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_540,(ulong)(pAVar10->_name)._M_dataplus._M_p);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar15) {
      local_500.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_500.field_2._8_8_ = plVar8[3];
    }
    else {
      local_500.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_500._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_500._M_string_length = plVar8[1];
    *plVar8 = (long)paVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_500);
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar15) {
      local_4e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_4e0.field_2._8_8_ = plVar8[3];
    }
    else {
      local_4e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_4e0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_4e0._M_string_length = plVar8[1];
    *plVar8 = (long)paVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_4e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if (local_540 != &local_530) {
      operator_delete(local_540);
    }
    if (local_5a0 != &local_590) {
      operator_delete(local_5a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    if ((LinearRegression *)local_5e0._0_8_ != (LinearRegression *)(local_5e0 + 0x10)) {
      operator_delete((void *)local_5e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p);
    }
    local_5e0._0_8_ = local_5e0 + 0x10;
    pLVar27 = (LinearRegression *)0x6;
    std::__cxx11::string::_M_construct((ulong)local_5e0,'\x06');
    typeToStr_abi_cxx11_(&local_5c0,pLVar27,pAVar10->_type);
    pp_Var31 = (_func_int **)0xf;
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      pp_Var31 = (_func_int **)local_5e0._16_8_;
    }
    if (pp_Var31 < (_func_int **)(local_5c0._M_string_length + local_5e0._8_8_)) {
      uVar33 = (_func_int **)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
        uVar33 = local_5c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar33 < (_func_int **)(local_5c0._M_string_length + local_5e0._8_8_))
      goto LAB_0014ce34;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_5c0,0,(char *)0x0,local_5e0._0_8_);
    }
    else {
LAB_0014ce34:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append(local_5e0,(ulong)local_5c0._M_dataplus._M_p);
    }
    local_5a0 = &local_590;
    ppFVar21 = (pointer *)(puVar11 + 2);
    if ((pointer *)*puVar11 == ppFVar21) {
      local_590 = *ppFVar21;
      lStack_588 = puVar11[3];
    }
    else {
      local_590 = *ppFVar21;
      local_5a0 = (pointer *)*puVar11;
    }
    local_598 = puVar11[1];
    *puVar11 = ppFVar21;
    puVar11[1] = 0;
    *(undefined1 *)ppFVar21 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_5a0);
    local_540 = &local_530;
    ppQVar14 = (Query **)(plVar8 + 2);
    if ((Query **)*plVar8 == ppQVar14) {
      local_530 = *ppQVar14;
      lStack_528 = plVar8[3];
    }
    else {
      local_530 = *ppQVar14;
      local_540 = (Query **)*plVar8;
    }
    local_538 = plVar8[1];
    *plVar8 = (long)ppQVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_540,(ulong)(pAVar10->_name)._M_dataplus._M_p);
    local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar15) {
      local_500.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_500.field_2._8_8_ = plVar8[3];
    }
    else {
      local_500.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_500._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_500._M_string_length = plVar8[1];
    *plVar8 = (long)paVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_500);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar15) {
      local_4e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_4e0.field_2._8_8_ = plVar8[3];
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    }
    else {
      local_4e0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_4e0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_4e0._M_string_length = plVar8[1];
    *plVar8 = (long)paVar15;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_58,(ulong)local_4e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
      operator_delete(local_4e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != &local_500.field_2) {
      operator_delete(local_500._M_dataplus._M_p);
    }
    if (local_540 != &local_530) {
      operator_delete(local_540);
    }
    if (local_5a0 != &local_590) {
      operator_delete(local_5a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
      operator_delete(local_5c0._M_dataplus._M_p);
    }
    if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
      operator_delete((void *)local_5e0._0_8_);
    }
    uVar36 = uVar36 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_540 = &local_530;
  std::__cxx11::string::_M_construct((ulong)&local_540,'\x0f');
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_540,0,(char *)0x0,0x2a6240);
  paVar25 = &local_500.field_2;
  puVar22 = (ulong *)(local_5e0 + 0x10);
  paVar3 = &local_520.field_2;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500.field_2._8_8_ = plVar8[3];
    local_500._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_500._M_string_length = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_500);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_4e0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_4e0.field_2._8_8_ = plVar8[3];
    local_4e0._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_4e0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_4e0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_4e0._M_string_length = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_4e0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != paVar15) {
    operator_delete(local_4e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar25) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  local_3a0 = &local_390;
  std::__cxx11::string::_M_construct((ulong)&local_3a0,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a0);
  local_4c0 = &local_4b0;
  p_Var17 = (__node_base *)(plVar8 + 2);
  if ((__node_base *)*plVar8 == p_Var17) {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    lStack_4a8 = plVar8[3];
  }
  else {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    local_4c0 = (__node_base *)*plVar8;
  }
  local_4b8 = plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_3e0 = &local_3d0;
  std::__cxx11::string::_M_construct((ulong)&local_3e0,'\x03');
  _Var29._M_nxt = (_Hash_node_base *)0xf;
  if (local_4c0 != &local_4b0) {
    _Var29._M_nxt = local_4b0._M_nxt;
  }
  if (_Var29._M_nxt < (_Hash_node_base *)(local_3d8 + local_4b8)) {
    p_Var28 = (_Hash_node_base *)0xf;
    if (local_3e0 != &local_3d0) {
      p_Var28 = local_3d0;
    }
    if (p_Var28 < (_Hash_node_base *)(local_3d8 + local_4b8)) goto LAB_0014d2f0;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3e0,0,(char *)0x0,(ulong)local_4c0);
  }
  else {
LAB_0014d2f0:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4c0,(ulong)local_3e0);
  }
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(puVar11 + 2);
  if ((_func_int ***)*puVar11 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = puVar11[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*puVar11;
  }
  local_418 = puVar11[1];
  *puVar11 = ppp_Var20;
  puVar11[1] = 0;
  *(undefined1 *)ppp_Var20 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_400 = &local_3f0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_3f0 = *plVar12;
    lStack_3e8 = plVar8[3];
  }
  else {
    local_3f0 = *plVar12;
    local_400 = (long *)*plVar8;
  }
  local_3f8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_58[0]);
  local_580._M_p = (pointer)&local_570;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_570._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_570._8_8_ = plVar8[3];
  }
  else {
    local_570._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_580._M_p = (pointer)*plVar8;
  }
  local_578 = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_3c0 = &local_3b0;
  std::__cxx11::string::_M_construct((ulong)&local_3c0,'\x06');
  uVar33 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    uVar33 = local_570._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (ulong)(local_3b8 + local_578)) {
    uVar36 = 0xf;
    if (local_3c0 != &local_3b0) {
      uVar36 = local_3b0;
    }
    if (uVar36 < (ulong)(local_3b8 + local_578)) goto LAB_0014d4a4;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3c0,0,(char *)0x0,(ulong)local_580._M_p);
  }
  else {
LAB_0014d4a4:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_3c0);
  }
  local_460 = &local_450;
  pp_Var1 = (__node_base_ptr *)(puVar11 + 2);
  if ((__node_base_ptr *)*puVar11 == pp_Var1) {
    local_450 = *pp_Var1;
    uStack_448 = puVar11[3];
  }
  else {
    local_450 = *pp_Var1;
    local_460 = (__node_base_ptr *)*puVar11;
  }
  local_458 = puVar11[1];
  *puVar11 = pp_Var1;
  puVar11[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_460);
  puVar18 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_520.field_2._M_allocated_capacity = *puVar18;
    local_520.field_2._8_8_ = plVar8[3];
    local_520._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_520.field_2._M_allocated_capacity = *puVar18;
    local_520._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_520._M_string_length = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_480 = &local_470;
  std::__cxx11::string::_M_construct((ulong)&local_480,'\x06');
  uVar33 = (_Hash_node_base *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    uVar33 = local_520.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (_Hash_node_base *)(local_478 + local_520._M_string_length)) {
    _Var29._M_nxt = (_Hash_node_base *)0xf;
    if (local_480 != &local_470) {
      _Var29._M_nxt = local_470._M_nxt;
    }
    if (_Var29._M_nxt < (_Hash_node_base *)(local_478 + local_520._M_string_length))
    goto LAB_0014d5f8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_480,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
  }
  else {
LAB_0014d5f8:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_480);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  psVar19 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560.field_2._8_8_ = puVar11[3];
  }
  else {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_560._M_string_length = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  psVar19 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *psVar19;
    local_5c0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_5c0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar19;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_98);
  puVar18 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar18) {
    local_5e0._16_8_ = *puVar18;
    local_5e0._24_8_ = puVar11[3];
    local_5e0._0_8_ = puVar22;
  }
  else {
    local_5e0._16_8_ = *puVar18;
    local_5e0._0_8_ = (ulong *)*puVar11;
  }
  local_5e0._8_8_ = puVar11[1];
  *puVar11 = puVar18;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_440 = &local_430;
  std::__cxx11::string::_M_construct((ulong)&local_440,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if ((ulong *)local_5e0._0_8_ != puVar22) {
    pp_Var31 = (_func_int **)local_5e0._16_8_;
  }
  if (pp_Var31 < (_func_int **)(local_438 + local_5e0._8_8_)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_440 != &local_430) {
      pp_Var31 = local_430;
    }
    if (pp_Var31 < (_func_int **)(local_438 + local_5e0._8_8_)) goto LAB_0014d79c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,local_5e0._0_8_);
  }
  else {
LAB_0014d79c:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_5e0,(ulong)local_440);
  }
  ppFVar21 = (pointer *)(puVar11 + 2);
  if ((pointer *)*puVar11 == ppFVar21) {
    local_590 = *ppFVar21;
    lStack_588 = puVar11[3];
    local_5a0 = &local_590;
  }
  else {
    local_590 = *ppFVar21;
    local_5a0 = (pointer *)*puVar11;
  }
  local_598 = puVar11[1];
  *puVar11 = ppFVar21;
  puVar11[1] = 0;
  *(undefined1 *)ppFVar21 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_5a0);
  ppQVar14 = (Query **)(puVar11 + 2);
  if ((Query **)*puVar11 == ppQVar14) {
    local_530 = *ppQVar14;
    lStack_528 = puVar11[3];
    local_540 = &local_530;
  }
  else {
    local_530 = *ppQVar14;
    local_540 = (Query **)*puVar11;
  }
  local_538 = puVar11[1];
  *puVar11 = ppQVar14;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_4a0 = &local_490;
  std::__cxx11::string::_M_construct((ulong)&local_4a0,'\x03');
  pQVar30 = (Query *)0xf;
  if (local_540 != &local_530) {
    pQVar30 = local_530;
  }
  if (pQVar30 < (Query *)(local_498 + local_538)) {
    pQVar30 = (Query *)0xf;
    if (local_4a0 != &local_490) {
      pQVar30 = local_490;
    }
    if (pQVar30 < (Query *)(local_498 + local_538)) goto LAB_0014d8df;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4a0,0,(char *)0x0,(ulong)local_540);
  }
  else {
LAB_0014d8df:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_4a0);
  }
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 == paVar16) {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500.field_2._8_8_ = puVar11[3];
    local_500._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_500._M_string_length = puVar11[1];
  *puVar11 = paVar16;
  puVar11[1] = 0;
  paVar16->_M_local_buf[0] = '\0';
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_500);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_4e0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_4e0.field_2._8_8_ = plVar8[3];
    local_4e0._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_4e0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_4e0._M_dataplus._M_p = (pointer)*plVar8;
  }
  paVar15 = &local_560.field_2;
  local_4e0._M_string_length = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != paVar25) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if ((ulong *)local_5e0._0_8_ != puVar22) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar15) {
    operator_delete(local_560._M_dataplus._M_p);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_d8 = &local_c8;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_c8 = *plVar12;
    lStack_c0 = plVar8[3];
  }
  else {
    local_c8 = *plVar12;
    local_d8 = (long *)*plVar8;
  }
  local_d0 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_380 = &local_370;
  puVar18 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar18) {
    local_370 = *puVar18;
    lStack_368 = plVar8[3];
  }
  else {
    local_370 = *puVar18;
    local_380 = (ulong *)*plVar8;
  }
  local_378 = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x03');
  uVar36 = 0xf;
  if (local_380 != &local_370) {
    uVar36 = local_370;
  }
  if (uVar36 < (ulong)(local_70 + local_378)) {
    uVar36 = 0xf;
    if (local_78 != local_68) {
      uVar36 = local_68[0];
    }
    if (uVar36 < (ulong)(local_70 + local_378)) goto LAB_0014dcf3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_0014dcf3:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_78);
  }
  local_2e0 = &local_2d0;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_2d0 = *puVar13;
    uStack_2c8 = puVar11[3];
  }
  else {
    local_2d0 = *puVar13;
    local_2e0 = (undefined8 *)*puVar11;
  }
  local_2d8 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_360 = &local_350;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_350 = *ppp_Var20;
    lStack_348 = plVar8[3];
  }
  else {
    local_350 = *ppp_Var20;
    local_360 = (_func_int ***)*plVar8;
  }
  local_358 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_360 != &local_350) {
    pp_Var31 = local_350;
  }
  if (pp_Var31 < (_func_int **)(local_f0 + local_358)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_f8 != local_e8) {
      pp_Var31 = local_e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_f0 + local_358)) goto LAB_0014de55;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_0014de55:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_f8);
  }
  local_2c0 = &local_2b0;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_2b0 = *puVar13;
    uStack_2a8 = puVar11[3];
  }
  else {
    local_2b0 = *puVar13;
    local_2c0 = (undefined8 *)*puVar11;
  }
  local_2b8 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_340 = &local_330;
  puVar18 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar18) {
    local_330 = *puVar18;
    lStack_328 = plVar8[3];
  }
  else {
    local_330 = *puVar18;
    local_340 = (ulong *)*plVar8;
  }
  local_338 = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  uVar36 = 0xf;
  if (local_340 != &local_330) {
    uVar36 = local_330;
  }
  if (uVar36 < (ulong)(local_110 + local_338)) {
    uVar36 = 0xf;
    if (local_118 != local_108) {
      uVar36 = local_108[0];
    }
    if (uVar36 < (ulong)(local_110 + local_338)) goto LAB_0014dfb7;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_0014dfb7:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_118);
  }
  local_2a0 = &local_290;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_290 = *puVar13;
    uStack_288 = puVar11[3];
  }
  else {
    local_290 = *puVar13;
    local_2a0 = (undefined8 *)*puVar11;
  }
  local_298 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_320 = &local_310;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_310 = *ppp_Var20;
    lStack_308 = plVar8[3];
  }
  else {
    local_310 = *ppp_Var20;
    local_320 = (_func_int ***)*plVar8;
  }
  local_318 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_320 != &local_310) {
    pp_Var31 = local_310;
  }
  if (pp_Var31 < (_func_int **)(local_130 + local_318)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_138 != local_128) {
      pp_Var31 = local_128[0];
    }
    if (pp_Var31 < (_func_int **)(local_130 + local_318)) goto LAB_0014e119;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_0014e119:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_138);
  }
  local_280 = &local_270;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_270 = *puVar13;
    uStack_268 = puVar11[3];
  }
  else {
    local_270 = *puVar13;
    local_280 = (undefined8 *)*puVar11;
  }
  local_278 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_300 = &local_2f0;
  puVar18 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar18) {
    local_2f0 = *puVar18;
    lStack_2e8 = plVar8[3];
  }
  else {
    local_2f0 = *puVar18;
    local_300 = (ulong *)*plVar8;
  }
  local_2f8 = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x06');
  uVar36 = 0xf;
  if (local_300 != &local_2f0) {
    uVar36 = local_2f0;
  }
  if (uVar36 < (ulong)(local_150 + local_2f8)) {
    uVar36 = 0xf;
    if (local_158 != local_148) {
      uVar36 = local_148[0];
    }
    if (uVar36 < (ulong)(local_150 + local_2f8)) goto LAB_0014e27b;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0014e27b:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_158);
  }
  local_4a0 = &local_490;
  ppQVar14 = (Query **)(puVar11 + 2);
  if ((Query **)*puVar11 == ppQVar14) {
    local_490 = *ppQVar14;
    uStack_488 = puVar11[3];
  }
  else {
    local_490 = *ppQVar14;
    local_4a0 = (Query **)*puVar11;
  }
  local_498 = puVar11[1];
  *puVar11 = ppQVar14;
  puVar11[1] = 0;
  *(undefined1 *)ppQVar14 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_440 = &local_430;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_430 = *ppp_Var20;
    lStack_428 = plVar8[3];
  }
  else {
    local_430 = *ppp_Var20;
    local_440 = (_func_int ***)*plVar8;
  }
  local_438 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_440 != &local_430) {
    pp_Var31 = local_430;
  }
  if (pp_Var31 < (_func_int **)(local_170 + local_438)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_178 != local_168) {
      pp_Var31 = local_168[0];
    }
    if (pp_Var31 < (_func_int **)(local_170 + local_438)) goto LAB_0014e3e5;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_440)
    ;
  }
  else {
LAB_0014e3e5:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_178);
  }
  local_480 = &local_470;
  p_Var17 = (__node_base *)(plVar8 + 2);
  if ((__node_base *)*plVar8 == p_Var17) {
    local_470._M_nxt = p_Var17->_M_nxt;
    lStack_468 = plVar8[3];
  }
  else {
    local_470._M_nxt = p_Var17->_M_nxt;
    local_480 = (__node_base *)*plVar8;
  }
  local_478 = plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)&p_Var17->_M_nxt = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_480);
  local_3c0 = &local_3b0;
  puVar18 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar18) {
    local_3b0 = *puVar18;
    lStack_3a8 = plVar8[3];
  }
  else {
    local_3b0 = *puVar18;
    local_3c0 = (ulong *)*plVar8;
  }
  local_3b8 = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\t');
  uVar36 = 0xf;
  if (local_3c0 != &local_3b0) {
    uVar36 = local_3b0;
  }
  if (uVar36 < (ulong)(local_190 + local_3b8)) {
    uVar36 = 0xf;
    if (local_198 != local_188) {
      uVar36 = local_188[0];
    }
    if (uVar36 < (ulong)(local_190 + local_3b8)) goto LAB_0014e54f;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_3c0);
  }
  else {
LAB_0014e54f:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_198);
  }
  local_3e0 = &local_3d0;
  pp_Var24 = (_Hash_node_base **)(puVar11 + 2);
  if ((_Hash_node_base **)*puVar11 == pp_Var24) {
    local_3d0 = *pp_Var24;
    lStack_3c8 = puVar11[3];
  }
  else {
    local_3d0 = *pp_Var24;
    local_3e0 = (_Hash_node_base **)*puVar11;
  }
  local_3d8 = puVar11[1];
  *puVar11 = pp_Var24;
  puVar11[1] = 0;
  *(undefined1 *)pp_Var24 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_3a0 = &local_390;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_390 = *ppp_Var20;
    lStack_388 = plVar8[3];
  }
  else {
    local_390 = *ppp_Var20;
    local_3a0 = (_func_int ***)*plVar8;
  }
  local_398 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_3a0 != &local_390) {
    pp_Var31 = local_390;
  }
  if (pp_Var31 < (_func_int **)(local_1b0 + local_398)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1b8 != local_1a8) {
      pp_Var31 = local_1a8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1b0 + local_398)) goto LAB_0014e6b9;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_3a0)
    ;
  }
  else {
LAB_0014e6b9:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_1b8);
  }
  local_4c0 = &local_4b0;
  p_Var17 = (__node_base *)(plVar8 + 2);
  if ((__node_base *)*plVar8 == p_Var17) {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    lStack_4a8 = plVar8[3];
  }
  else {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    local_4c0 = (__node_base *)*plVar8;
  }
  local_4b8 = plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)&p_Var17->_M_nxt = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = plVar8[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*plVar8;
  }
  local_418 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_420 != &local_410) {
    pp_Var31 = local_410;
  }
  if (pp_Var31 < (_func_int **)(local_1d0 + local_418)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1d8 != local_1c8) {
      pp_Var31 = local_1c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1d0 + local_418)) goto LAB_0014e823;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_0014e823:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_1d8);
  }
  local_400 = &local_3f0;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_3f0 = *plVar8;
    lStack_3e8 = puVar11[3];
  }
  else {
    local_3f0 = *plVar8;
    local_400 = (long *)*puVar11;
  }
  local_3f8 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_580._M_p = (pointer)&local_570;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_570._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_570._8_8_ = plVar8[3];
  }
  else {
    local_570._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_580._M_p = (pointer)*plVar8;
  }
  local_578 = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  uVar33 = (_func_int **)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    uVar33 = local_570._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (_func_int **)(local_1f0 + local_578)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1f8 != local_1e8) {
      pp_Var31 = local_1e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1f0 + local_578)) goto LAB_0014e972;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_580._M_p);
  }
  else {
LAB_0014e972:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_1f8);
  }
  local_460 = &local_450;
  pp_Var1 = (__node_base_ptr *)(puVar11 + 2);
  if ((__node_base_ptr *)*puVar11 == pp_Var1) {
    local_450 = *pp_Var1;
    uStack_448 = puVar11[3];
  }
  else {
    local_450 = *pp_Var1;
    local_460 = (__node_base_ptr *)*puVar11;
  }
  local_458 = puVar11[1];
  *puVar11 = pp_Var1;
  puVar11[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
  puVar18 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_520.field_2._M_allocated_capacity = *puVar18;
    local_520.field_2._8_8_ = puVar11[3];
    local_520._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_520.field_2._M_allocated_capacity = *puVar18;
    local_520._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_520._M_string_length = puVar11[1];
  *puVar11 = puVar18;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\t');
  uVar33 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    uVar33 = local_520.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (pointer)(local_210 + local_520._M_string_length)) {
    puVar32 = (pointer)0xf;
    if (local_218 != local_208) {
      puVar32 = local_208[0];
    }
    if (puVar32 < (pointer)(local_210 + local_520._M_string_length)) goto LAB_0014eaca;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_218,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
  }
  else {
LAB_0014eaca:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_218);
  }
  psVar19 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560.field_2._8_8_ = puVar11[3];
    local_560._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_560._M_string_length = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  puVar18 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar18) {
    local_5c0.field_2._M_allocated_capacity = *puVar18;
    local_5c0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *puVar18;
    local_5c0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_5c0._M_string_length = plVar8[1];
  *plVar8 = (long)puVar18;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x06');
  uVar33 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    uVar33 = local_5c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (pointer)(local_230 + local_5c0._M_string_length)) {
    puVar32 = (pointer)0xf;
    if (local_238 != local_228) {
      puVar32 = local_228[0];
    }
    if (puVar32 < (pointer)(local_230 + local_5c0._M_string_length)) goto LAB_0014ec13;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_238,0,(char *)0x0,(ulong)local_5c0._M_dataplus._M_p);
  }
  else {
LAB_0014ec13:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_238);
  }
  puVar18 = puVar11 + 2;
  if ((ulong *)*puVar11 == puVar18) {
    local_5e0._16_8_ = *puVar18;
    local_5e0._24_8_ = puVar11[3];
    local_5e0._0_8_ = puVar22;
  }
  else {
    local_5e0._16_8_ = *puVar18;
    local_5e0._0_8_ = (ulong *)*puVar11;
  }
  local_5e0._8_8_ = puVar11[1];
  *puVar11 = puVar18;
  puVar11[1] = 0;
  *(undefined1 *)puVar18 = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append(local_5e0);
  ppFVar21 = (pointer *)(puVar11 + 2);
  if ((pointer *)*puVar11 == ppFVar21) {
    local_590 = *ppFVar21;
    lStack_588 = puVar11[3];
    local_5a0 = &local_590;
  }
  else {
    local_590 = *ppFVar21;
    local_5a0 = (pointer *)*puVar11;
  }
  local_598 = puVar11[1];
  *puVar11 = ppFVar21;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  local_258 = local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x03');
  pFVar34 = (pointer)0xf;
  if (local_5a0 != &local_590) {
    pFVar34 = local_590;
  }
  if (pFVar34 < (pointer)(local_598 + local_250)) {
    pFVar34 = (pointer)0xf;
    if (local_258 != local_248) {
      pFVar34 = local_248[0];
    }
    if (pFVar34 < (pointer)(local_598 + local_250)) goto LAB_0014ed40;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_5a0);
  }
  else {
LAB_0014ed40:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a0,(ulong)local_258);
  }
  ppQVar14 = (Query **)(puVar11 + 2);
  if ((Query **)*puVar11 == ppQVar14) {
    local_530 = *ppQVar14;
    lStack_528 = puVar11[3];
    local_540 = &local_530;
  }
  else {
    local_530 = *ppQVar14;
    local_540 = (Query **)*puVar11;
  }
  local_538 = puVar11[1];
  *puVar11 = ppQVar14;
  puVar11[1] = 0;
  *(undefined1 *)ppQVar14 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_540);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar16) {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500.field_2._8_8_ = plVar8[3];
    local_500._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_500.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_500._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_500._M_string_length = plVar8[1];
  *plVar8 = (long)paVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if ((ulong *)local_5e0._0_8_ != puVar22) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != paVar15) {
    operator_delete(local_560._M_dataplus._M_p);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar3) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  local_540 = &local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"");
  uVar36 = 0;
  pLVar27 = local_260;
  do {
    if (((pLVar27->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar36 >> 6] >>
         (uVar36 & 0x3f) & 1) != 0) {
      pAVar10 = TreeDecomposition::getAttribute
                          ((pLVar27->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           uVar36);
      if (((pLVar27->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar36 >> 6] &
          1L << ((byte)uVar36 & 0x3f)) == 0) {
        __val = (pLVar27->_parameterIndex).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar36];
        cVar26 = '\x01';
        if (9 < __val) {
          uVar23 = __val;
          cVar7 = '\x04';
          do {
            cVar26 = cVar7;
            if (uVar23 < 100) {
              cVar26 = cVar26 + -2;
              goto LAB_0014f4b8;
            }
            if (uVar23 < 1000) {
              cVar26 = cVar26 + -1;
              goto LAB_0014f4b8;
            }
            if (uVar23 < 10000) goto LAB_0014f4b8;
            bVar4 = 99999 < uVar23;
            uVar23 = uVar23 / 10000;
            cVar7 = cVar26 + '\x04';
          } while (bVar4);
          cVar26 = cVar26 + '\x01';
        }
LAB_0014f4b8:
        local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_520,cVar26);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_520._M_dataplus._M_p,(uint)local_520._M_string_length,__val);
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_520,0,(char *)0x0,0x2a56af);
        local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
        psVar19 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_560.field_2._M_allocated_capacity = *psVar19;
          local_560.field_2._8_8_ = puVar11[3];
        }
        else {
          local_560.field_2._M_allocated_capacity = *psVar19;
          local_560._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_560._M_string_length = puVar11[1];
        *puVar11 = psVar19;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_560);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        puVar22 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_5c0.field_2._M_allocated_capacity = *puVar22;
          local_5c0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *puVar22;
          local_5c0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_5c0._M_string_length = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_5c0,(ulong)(pAVar10->_name)._M_dataplus._M_p);
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5e0._16_8_ = *puVar22;
          local_5e0._24_8_ = puVar11[3];
          local_5e0._0_8_ = local_5e0 + 0x10;
        }
        else {
          local_5e0._16_8_ = *puVar22;
          local_5e0._0_8_ = (ulong *)*puVar11;
        }
        local_5e0._8_8_ = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_5e0);
        ppFVar21 = (pointer *)(puVar11 + 2);
        if ((pointer *)*puVar11 == ppFVar21) {
          local_590 = *ppFVar21;
          lStack_588 = puVar11[3];
          local_5a0 = &local_590;
        }
        else {
          local_590 = *ppFVar21;
          local_5a0 = (pointer *)*puVar11;
        }
        local_598 = puVar11[1];
        *puVar11 = ppFVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_5a0);
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
          operator_delete((void *)local_5e0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p);
        }
        pLVar27 = local_260;
        _Var35._M_p = local_520._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) goto LAB_0014f492;
      }
      else {
        std::operator+(&local_560,"params[index_",&pAVar10->_name);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_560);
        local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
        puVar22 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar22) {
          local_5c0.field_2._M_allocated_capacity = *puVar22;
          local_5c0.field_2._8_8_ = puVar11[3];
        }
        else {
          local_5c0.field_2._M_allocated_capacity = *puVar22;
          local_5c0._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_5c0._M_string_length = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_5c0,(ulong)(pAVar10->_name)._M_dataplus._M_p);
        puVar22 = puVar11 + 2;
        if ((ulong *)*puVar11 == puVar22) {
          local_5e0._16_8_ = *puVar22;
          local_5e0._24_8_ = puVar11[3];
          local_5e0._0_8_ = local_5e0 + 0x10;
        }
        else {
          local_5e0._16_8_ = *puVar22;
          local_5e0._0_8_ = (ulong *)*puVar11;
        }
        local_5e0._8_8_ = puVar11[1];
        *puVar11 = puVar22;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        puVar11 = (undefined8 *)std::__cxx11::string::append(local_5e0);
        ppFVar21 = (pointer *)(puVar11 + 2);
        if ((pointer *)*puVar11 == ppFVar21) {
          local_590 = *ppFVar21;
          lStack_588 = puVar11[3];
          local_5a0 = &local_590;
        }
        else {
          local_590 = *ppFVar21;
          local_5a0 = (pointer *)*puVar11;
        }
        local_598 = puVar11[1];
        *puVar11 = ppFVar21;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_5a0);
        if (local_5a0 != &local_590) {
          operator_delete(local_5a0);
        }
        if ((undefined1 *)local_5e0._0_8_ != local_5e0 + 0x10) {
          operator_delete((void *)local_5e0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
          operator_delete(local_5c0._M_dataplus._M_p);
        }
        pLVar27 = local_260;
        _Var35._M_p = local_560._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
LAB_0014f492:
          operator_delete(_Var35._M_p);
          pLVar27 = local_260;
        }
      }
    }
    uVar36 = uVar36 + 1;
  } while (uVar36 != 100);
  std::__cxx11::string::pop_back();
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  pcVar2 = local_5e0 + 0x10;
  paVar15 = &local_520.field_2;
  local_b8 = &local_a8;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_a8 = *ppp_Var20;
    lStack_a0 = plVar8[3];
  }
  else {
    local_a8 = *ppp_Var20;
    local_b8 = (_func_int ***)*plVar8;
  }
  local_b0 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
  pp_Var31 = (_func_int **)0xf;
  if (local_b8 != &local_a8) {
    pp_Var31 = local_a8;
  }
  if (pp_Var31 < (_func_int **)(local_f0 + local_b0)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_f8 != local_e8) {
      pp_Var31 = local_e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_f0 + local_b0)) goto LAB_0014f828;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_0014f828:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_f8);
  }
  local_d8 = &local_c8;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_c8 = *plVar8;
    lStack_c0 = puVar11[3];
  }
  else {
    local_c8 = *plVar8;
    local_d8 = (long *)*puVar11;
  }
  local_d0 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_380 = &local_370;
  puVar22 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar22) {
    local_370 = *puVar22;
    lStack_368 = plVar8[3];
  }
  else {
    local_370 = *puVar22;
    local_380 = (ulong *)*plVar8;
  }
  local_378 = plVar8[1];
  *plVar8 = (long)puVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,'\x06');
  uVar36 = 0xf;
  if (local_380 != &local_370) {
    uVar36 = local_370;
  }
  if (uVar36 < (ulong)(local_110 + local_378)) {
    uVar36 = 0xf;
    if (local_118 != local_108) {
      uVar36 = local_108[0];
    }
    if (uVar36 < (ulong)(local_110 + local_378)) goto LAB_0014f991;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_380);
  }
  else {
LAB_0014f991:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_118);
  }
  local_2e0 = &local_2d0;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_2d0 = *puVar13;
    uStack_2c8 = puVar11[3];
  }
  else {
    local_2d0 = *puVar13;
    local_2e0 = (undefined8 *)*puVar11;
  }
  local_2d8 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_360 = &local_350;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_350 = *ppp_Var20;
    lStack_348 = plVar8[3];
  }
  else {
    local_350 = *ppp_Var20;
    local_360 = (_func_int ***)*plVar8;
  }
  local_358 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_360 != &local_350) {
    pp_Var31 = local_350;
  }
  if (pp_Var31 < (_func_int **)(local_130 + local_358)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_138 != local_128) {
      pp_Var31 = local_128[0];
    }
    if (pp_Var31 < (_func_int **)(local_130 + local_358)) goto LAB_0014fafa;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_360);
  }
  else {
LAB_0014fafa:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_138);
  }
  local_2c0 = &local_2b0;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_2b0 = *puVar13;
    uStack_2a8 = puVar11[3];
  }
  else {
    local_2b0 = *puVar13;
    local_2c0 = (undefined8 *)*puVar11;
  }
  local_2b8 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  local_340 = &local_330;
  puVar22 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar22) {
    local_330 = *puVar22;
    lStack_328 = plVar8[3];
  }
  else {
    local_330 = *puVar22;
    local_340 = (ulong *)*plVar8;
  }
  local_338 = plVar8[1];
  *plVar8 = (long)puVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_158 = local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,'\x06');
  uVar36 = 0xf;
  if (local_340 != &local_330) {
    uVar36 = local_330;
  }
  if (uVar36 < (ulong)(local_150 + local_338)) {
    uVar36 = 0xf;
    if (local_158 != local_148) {
      uVar36 = local_148[0];
    }
    if (uVar36 < (ulong)(local_150 + local_338)) goto LAB_0014fc63;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_340);
  }
  else {
LAB_0014fc63:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_158);
  }
  local_2a0 = &local_290;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_290 = *puVar13;
    uStack_288 = puVar11[3];
  }
  else {
    local_290 = *puVar13;
    local_2a0 = (undefined8 *)*puVar11;
  }
  local_298 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
  local_320 = &local_310;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_310 = *ppp_Var20;
    lStack_308 = plVar8[3];
  }
  else {
    local_310 = *ppp_Var20;
    local_320 = (_func_int ***)*plVar8;
  }
  local_318 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_178 = local_168;
  std::__cxx11::string::_M_construct((ulong)&local_178,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_320 != &local_310) {
    pp_Var31 = local_310;
  }
  if (pp_Var31 < (_func_int **)(local_170 + local_318)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_178 != local_168) {
      pp_Var31 = local_168[0];
    }
    if (pp_Var31 < (_func_int **)(local_170 + local_318)) goto LAB_0014fdcc;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_320);
  }
  else {
LAB_0014fdcc:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_178);
  }
  local_280 = &local_270;
  puVar13 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar13) {
    local_270 = *puVar13;
    uStack_268 = puVar11[3];
  }
  else {
    local_270 = *puVar13;
    local_280 = (undefined8 *)*puVar11;
  }
  local_278 = puVar11[1];
  *puVar11 = puVar13;
  puVar11[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_280);
  local_300 = &local_2f0;
  puVar22 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar22) {
    local_2f0 = *puVar22;
    lStack_2e8 = plVar8[3];
  }
  else {
    local_2f0 = *puVar22;
    local_300 = (ulong *)*plVar8;
  }
  local_2f8 = plVar8[1];
  *plVar8 = (long)puVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_198 = local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,'\x06');
  uVar36 = 0xf;
  if (local_300 != &local_2f0) {
    uVar36 = local_2f0;
  }
  if (uVar36 < (ulong)(local_190 + local_2f8)) {
    uVar36 = 0xf;
    if (local_198 != local_188) {
      uVar36 = local_188[0];
    }
    if (uVar36 < (ulong)(local_190 + local_2f8)) goto LAB_0014ff35;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_300);
  }
  else {
LAB_0014ff35:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_198);
  }
  local_4a0 = &local_490;
  ppQVar14 = (Query **)(puVar11 + 2);
  if ((Query **)*puVar11 == ppQVar14) {
    local_490 = *ppQVar14;
    uStack_488 = puVar11[3];
  }
  else {
    local_490 = *ppQVar14;
    local_4a0 = (Query **)*puVar11;
  }
  local_498 = puVar11[1];
  *puVar11 = ppQVar14;
  puVar11[1] = 0;
  *(undefined1 *)ppQVar14 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4a0);
  local_440 = &local_430;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_430 = *ppp_Var20;
    lStack_428 = plVar8[3];
  }
  else {
    local_430 = *ppp_Var20;
    local_440 = (_func_int ***)*plVar8;
  }
  local_438 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_440 != &local_430) {
    pp_Var31 = local_430;
  }
  if (pp_Var31 < (_func_int **)(local_1b0 + local_438)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1b8 != local_1a8) {
      pp_Var31 = local_1a8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1b0 + local_438)) goto LAB_0015009e;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_440)
    ;
  }
  else {
LAB_0015009e:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_1b8);
  }
  local_480 = &local_470;
  p_Var17 = (__node_base *)(plVar8 + 2);
  if ((__node_base *)*plVar8 == p_Var17) {
    local_470._M_nxt = p_Var17->_M_nxt;
    lStack_468 = plVar8[3];
  }
  else {
    local_470._M_nxt = p_Var17->_M_nxt;
    local_480 = (__node_base *)*plVar8;
  }
  local_478 = plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)&p_Var17->_M_nxt = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_480);
  local_3c0 = &local_3b0;
  puVar22 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar22) {
    local_3b0 = *puVar22;
    lStack_3a8 = plVar8[3];
  }
  else {
    local_3b0 = *puVar22;
    local_3c0 = (ulong *)*plVar8;
  }
  local_3b8 = plVar8[1];
  *plVar8 = (long)puVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_3c0,(ulong)local_540);
  local_3e0 = &local_3d0;
  pp_Var24 = (_Hash_node_base **)(plVar8 + 2);
  if ((_Hash_node_base **)*plVar8 == pp_Var24) {
    local_3d0 = *pp_Var24;
    lStack_3c8 = plVar8[3];
  }
  else {
    local_3d0 = *pp_Var24;
    local_3e0 = (_Hash_node_base **)*plVar8;
  }
  local_3d8 = plVar8[1];
  *plVar8 = (long)pp_Var24;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3e0);
  local_3a0 = &local_390;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_390 = *ppp_Var20;
    lStack_388 = plVar8[3];
  }
  else {
    local_390 = *ppp_Var20;
    local_3a0 = (_func_int ***)*plVar8;
  }
  local_398 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,'\t');
  pp_Var31 = (_func_int **)0xf;
  if (local_3a0 != &local_390) {
    pp_Var31 = local_390;
  }
  if (pp_Var31 < (_func_int **)(local_1d0 + local_398)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1d8 != local_1c8) {
      pp_Var31 = local_1c8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1d0 + local_398)) goto LAB_001502da;
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_3a0)
    ;
  }
  else {
LAB_001502da:
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_1d8);
  }
  local_4c0 = &local_4b0;
  p_Var17 = (__node_base *)(plVar8 + 2);
  if ((__node_base *)*plVar8 == p_Var17) {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    lStack_4a8 = plVar8[3];
  }
  else {
    local_4b0._M_nxt = p_Var17->_M_nxt;
    local_4c0 = (__node_base *)*plVar8;
  }
  local_4b8 = plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)&p_Var17->_M_nxt = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
  local_420 = &local_410;
  ppp_Var20 = (_func_int ***)(plVar8 + 2);
  if ((_func_int ***)*plVar8 == ppp_Var20) {
    local_410 = *ppp_Var20;
    lStack_408 = plVar8[3];
  }
  else {
    local_410 = *ppp_Var20;
    local_420 = (_func_int ***)*plVar8;
  }
  local_418 = plVar8[1];
  *plVar8 = (long)ppp_Var20;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,'\x06');
  pp_Var31 = (_func_int **)0xf;
  if (local_420 != &local_410) {
    pp_Var31 = local_410;
  }
  if (pp_Var31 < (_func_int **)(local_1f0 + local_418)) {
    pp_Var31 = (_func_int **)0xf;
    if (local_1f8 != local_1e8) {
      pp_Var31 = local_1e8[0];
    }
    if (pp_Var31 < (_func_int **)(local_1f0 + local_418)) goto LAB_00150443;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_420);
  }
  else {
LAB_00150443:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_1f8);
  }
  local_400 = &local_3f0;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_3f0 = *plVar8;
    lStack_3e8 = puVar11[3];
  }
  else {
    local_3f0 = *plVar8;
    local_400 = (long *)*puVar11;
  }
  local_3f8 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_400);
  local_580._M_p = (pointer)&local_570;
  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar25) {
    local_570._M_allocated_capacity = paVar25->_M_allocated_capacity;
    local_570._8_8_ = plVar8[3];
  }
  else {
    local_570._M_allocated_capacity = paVar25->_M_allocated_capacity;
    local_580._M_p = (pointer)*plVar8;
  }
  local_578 = plVar8[1];
  *plVar8 = (long)paVar25;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_218 = local_208;
  std::__cxx11::string::_M_construct((ulong)&local_218,'\x06');
  uVar33 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    uVar33 = local_570._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (pointer)(local_210 + local_578)) {
    puVar32 = (pointer)0xf;
    if (local_218 != local_208) {
      puVar32 = local_208[0];
    }
    if (puVar32 < (pointer)(local_210 + local_578)) goto LAB_00150591;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_580._M_p);
  }
  else {
LAB_00150591:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_580,(ulong)local_218);
  }
  local_460 = &local_450;
  pp_Var1 = (__node_base_ptr *)(puVar11 + 2);
  if ((__node_base_ptr *)*puVar11 == pp_Var1) {
    local_450 = *pp_Var1;
    uStack_448 = puVar11[3];
  }
  else {
    local_450 = *pp_Var1;
    local_460 = (__node_base_ptr *)*puVar11;
  }
  local_458 = puVar11[1];
  *puVar11 = pp_Var1;
  puVar11[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_460);
  puVar22 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar22) {
    local_520.field_2._M_allocated_capacity = *puVar22;
    local_520.field_2._8_8_ = plVar8[3];
    local_520._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_520.field_2._M_allocated_capacity = *puVar22;
    local_520._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_520._M_string_length = plVar8[1];
  *plVar8 = (long)puVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct((ulong)&local_238,'\x06');
  uVar33 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar15) {
    uVar33 = local_520.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (pointer)(local_230 + local_520._M_string_length)) {
    puVar32 = (pointer)0xf;
    if (local_238 != local_228) {
      puVar32 = local_228[0];
    }
    if (puVar32 < (pointer)(local_230 + local_520._M_string_length)) goto LAB_001506e8;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_238,0,(char *)0x0,(ulong)local_520._M_dataplus._M_p);
  }
  else {
LAB_001506e8:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_520,(ulong)local_238);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  psVar19 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560.field_2._8_8_ = puVar11[3];
  }
  else {
    local_560.field_2._M_allocated_capacity = *psVar19;
    local_560._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_560._M_string_length = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(undefined1 *)psVar19 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_560);
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  plVar12 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar12) {
    local_5c0.field_2._M_allocated_capacity = *plVar12;
    local_5c0.field_2._8_8_ = plVar8[3];
  }
  else {
    local_5c0.field_2._M_allocated_capacity = *plVar12;
    local_5c0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_5c0._M_string_length = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_258 = local_248;
  std::__cxx11::string::_M_construct((ulong)&local_258,'\x03');
  uVar33 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    uVar33 = local_5c0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar33 < (pointer)(local_250 + local_5c0._M_string_length)) {
    pFVar34 = (pointer)0xf;
    if (local_258 != local_248) {
      pFVar34 = local_248[0];
    }
    if ((pointer)(local_250 + local_5c0._M_string_length) <= pFVar34) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_258,0,(char *)0x0,(ulong)local_5c0._M_dataplus._M_p);
      goto LAB_0015085b;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5c0,(ulong)local_258);
LAB_0015085b:
  psVar19 = puVar11 + 2;
  if ((size_type *)*puVar11 == psVar19) {
    local_5e0._16_8_ = *psVar19;
    local_5e0._24_8_ = puVar11[3];
    local_5e0._0_8_ = pcVar2;
  }
  else {
    local_5e0._16_8_ = *psVar19;
    local_5e0._0_8_ = (size_type *)*puVar11;
  }
  local_5e0._8_8_ = puVar11[1];
  *puVar11 = psVar19;
  puVar11[1] = 0;
  *(char *)psVar19 = '\0';
  plVar8 = (long *)std::__cxx11::string::append(local_5e0);
  ppFVar21 = (pointer *)(plVar8 + 2);
  if ((pointer *)*plVar8 == ppFVar21) {
    local_590 = *ppFVar21;
    lStack_588 = plVar8[3];
    local_5a0 = &local_590;
  }
  else {
    local_590 = *ppFVar21;
    local_5a0 = (pointer *)*plVar8;
  }
  local_598 = plVar8[1];
  *plVar8 = (long)ppFVar21;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((pointer)local_5e0._0_8_ != pcVar2) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p);
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != paVar15) {
    operator_delete(local_520._M_dataplus._M_p);
  }
  psVar6 = local_38;
  if (local_460 != &local_450) {
    operator_delete(local_460);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420);
  }
  if (local_4c0 != &local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_480 != &local_470) {
    operator_delete(local_480);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440);
  }
  if (local_4a0 != &local_490) {
    operator_delete(local_4a0);
  }
  if (local_198 != local_188) {
    operator_delete(local_198);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_2a0 != &local_290) {
    operator_delete(local_2a0);
  }
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  if (local_340 != &local_330) {
    operator_delete(local_340);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
                 &local_4e0,&local_500);
  plVar8 = (long *)std::__cxx11::string::_M_append(local_5e0,(ulong)local_5a0);
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  psVar19 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar19) {
    lVar5 = plVar8[3];
    (psVar6->field_2)._M_allocated_capacity = *psVar19;
    *(long *)((long)&psVar6->field_2 + 8) = lVar5;
  }
  else {
    (psVar6->_M_dataplus)._M_p = (pointer)*plVar8;
    (psVar6->field_2)._M_allocated_capacity = *psVar19;
  }
  psVar6->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar19;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((pointer)local_5e0._0_8_ != pcVar2) {
    operator_delete((void *)local_5e0._0_8_);
  }
  if (local_5a0 != &local_590) {
    operator_delete(local_5a0);
  }
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return psVar6;
}

Assistant:

std::string LinearRegression::generateTestDataEvaluation()
{
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"test_data.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";
    
    std::string prediction = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        
        if (_categoricalFeatures[var])
            prediction += "params[index_"+att->_name+"[tuple."+att->_name+"]]+";
        else
            prediction += "params["+std::to_string(_parameterIndex[var])+
                "]*tuple."+att->_name+"+";
    }
    prediction.pop_back();
    
    std::string evalFunction = offset(1)+"void evaluateModel()\n"+offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"double diff, error = 0.0;\n"+
        offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"diff = params[0]+"+prediction+";\n"+
        offset(3)+"error += diff * diff;\n"+
        offset(2)+"}\n"+
        offset(2)+"error /= TestDataset.size();\n"+
        offset(2)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}